

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
SmallArray<DelayedType,_32U>::SmallArray(SmallArray<DelayedType,_32U> *this,Allocator *allocator)

{
  long lVar1;
  
  lVar1 = 0x18;
  do {
    *(undefined4 *)((long)this->little + lVar1 + -0x18) = 0;
    *(undefined8 *)((long)&((SmallArray<DelayedType,_32U> *)(this->little + -1))->data + lVar1) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x218);
  this->allocator = allocator;
  this->data = this->little;
  this->count = 0;
  this->max = 0x20;
  return;
}

Assistant:

SmallArray(Allocator *allocator = 0): allocator(allocator)
	{
		data = little;
		max = N;

		count = 0;
	}